

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  undefined8 *puVar1;
  ImVec2 IVar2;
  undefined8 uVar3;
  ImDrawList *pIVar4;
  ImGuiWindow *this;
  ImFont *font;
  undefined1 auVar5 [16];
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ImGuiWindow *pIVar16;
  ImU32 IVar17;
  ulong uVar18;
  char *text_end;
  uint uVar19;
  ImVec2 IVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  ImRect IVar38;
  ImVec4 local_c8;
  undefined1 local_b0 [8];
  ImVec2 IStack_a8;
  ImRect *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  ImVec2 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  ImVec2 *local_58;
  ImDrawList *local_50;
  ImGuiWindow *local_48;
  undefined1 local_40 [16];
  
  IVar20 = (ImVec2)GImGui;
  local_48 = GImGui->CurrentWindow;
  local_68 = (bb->Min).x;
  fStack_64 = (bb->Min).y;
  uStack_60 = 0;
  local_88._8_8_ = 0;
  local_88._0_4_ = (bb->Max).x;
  local_88._4_4_ = (bb->Max).y;
  local_78 = (viewport->super_ImGuiViewport).Pos;
  uStack_70 = 0;
  local_98._8_8_ = 0;
  local_98._0_4_ = (viewport->super_ImGuiViewport).Size.x;
  local_98._4_4_ = (viewport->super_ImGuiViewport).Size.y;
  pIVar4 = local_48->DrawList;
  local_c8.x = (GImGui->Style).Colors[5].x;
  local_c8.y = (GImGui->Style).Colors[5].y;
  uVar6 = (GImGui->Style).Colors[5].z;
  uVar7 = (GImGui->Style).Colors[5].w;
  local_c8.w = (GImGui->Style).Alpha * 0.4 * (float)uVar7;
  local_c8.z = (float)uVar6;
  local_50 = draw_list;
  IVar17 = ColorConvertFloat4ToU32(&local_c8);
  local_a0 = bb;
  local_58 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar4,&bb->Min,&bb->Max,IVar17,0.0,0xf);
  uVar19 = (((ImGuiContext *)IVar20)->Windows).Size;
  if (uVar19 != 0) {
    auVar5._4_4_ = fStack_64;
    auVar5._0_4_ = local_68;
    auVar5._8_8_ = uStack_60;
    auVar21 = vsubps_avx(local_88,auVar5);
    local_88 = vdivps_avx(auVar21,local_98);
    auVar21._0_4_ = local_88._0_4_ * local_78.x;
    auVar21._4_4_ = local_88._4_4_ * local_78.y;
    auVar21._8_4_ = local_88._8_4_ * (float)uStack_70;
    auVar21._12_4_ = local_88._12_4_ * uStack_70._4_4_;
    local_98 = vsubps_avx(auVar5,auVar21);
    uVar18 = 0;
    local_78 = IVar20;
    do {
      if ((long)(int)uVar19 <= (long)uVar18) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      this = (*(ImGuiWindow ***)((long)IVar20 + 0x1a90))[uVar18];
      if ((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) {
        IVar2 = this->Pos;
        auVar22._8_8_ = 0;
        auVar22._0_4_ = IVar2.x;
        auVar22._4_4_ = IVar2.y;
        auVar25._0_4_ = IVar2.x + (this->Size).x;
        auVar25._4_4_ = IVar2.y + (this->Size).y;
        auVar25._8_8_ = 0;
        _local_b0 = vmovlhps_avx(auVar22,auVar25);
        uVar24 = local_b0._8_8_;
        IVar38 = ImGuiWindow::TitleBarRect(this);
        pIVar16 = local_48;
        fVar30 = local_88._0_4_;
        fVar34 = local_98._0_4_;
        auVar5 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar34 + fVar30 * IVar38.Max.x)));
        auVar26._8_8_ = 0;
        auVar26._0_4_ = (local_a0->Min).x;
        auVar26._4_4_ = (local_a0->Min).y;
        auVar27._8_8_ = 0;
        auVar27._0_4_ = (local_a0->Max).x;
        auVar27._4_4_ = (local_a0->Max).y;
        fVar31 = local_88._4_4_;
        fVar32 = local_88._8_4_;
        fVar33 = local_88._12_4_;
        fVar35 = local_98._4_4_;
        fVar36 = local_98._8_4_;
        fVar37 = local_98._12_4_;
        auVar28._0_4_ = (int)(fVar34 + fVar30 * local_b0._0_4_);
        auVar28._4_4_ = (int)(fVar35 + fVar31 * local_b0._4_4_);
        auVar28._8_4_ = (int)(fVar36 + fVar32 * 0.0);
        auVar28._12_4_ = (int)(fVar37 + fVar33 * 0.0);
        auVar22 = vcvtdq2ps_avx(auVar28);
        auVar21 = vcmpps_avx(auVar22,auVar26,1);
        auVar22 = vminps_avx(auVar27,auVar22);
        auVar21 = vblendvps_avx(auVar22,auVar26,auVar21);
        uVar3 = vmovlps_avx(auVar21);
        auVar29._0_4_ = (int)(fVar34 + fVar30 * local_b0._8_4_);
        auVar29._4_4_ = (int)(fVar35 + fVar31 * local_b0._12_4_);
        auVar29._8_4_ = (int)(fVar36 + fVar32 * 0.0);
        auVar29._12_4_ = (int)(fVar37 + fVar33 * 0.0);
        auVar22 = vcvtdq2ps_avx(auVar29);
        auVar21 = vcmpps_avx(auVar22,auVar26,1);
        auVar22 = vminps_avx(auVar27,auVar22);
        auVar21 = vblendvps_avx(auVar22,auVar26,auVar21);
        IStack_a8 = (ImVec2)vmovlps_avx(auVar21);
        local_b0 = (undefined1  [8])uVar3;
        auVar23._0_4_ = (int)(fVar34 + fVar30 * IVar38.Min.x);
        auVar23._4_4_ = (int)(fVar35 + fVar31 * IVar38.Min.y);
        auVar23._8_4_ = (int)(fVar36 + fVar32 * (float)uVar24);
        auVar23._12_4_ = (int)(fVar37 + fVar33 * (float)((ulong)uVar24 >> 0x20));
        auVar22 = vcvtdq2ps_avx(auVar23);
        auVar21 = vmovshdup_avx(auVar22);
        auVar23 = vinsertps_avx(auVar5,ZEXT416((uint)(auVar21._0_4_ + 5.0)),0x1c);
        auVar21 = vcmpps_avx(auVar22,auVar26,1);
        auVar5 = vminps_avx(auVar27,auVar22);
        auVar21 = vblendvps_avx(auVar5,auVar26,auVar21);
        auVar5 = vcmpps_avx(auVar23,auVar26,1);
        auVar22 = vminps_avx(auVar27,auVar23);
        auVar5 = vblendvps_avx(auVar22,auVar26,auVar5);
        local_40 = vmovlhps_avx(auVar21,auVar5);
        if (*(ImGuiWindow **)((long)IVar20 + 0x1ca0) == (ImGuiWindow *)0x0) {
          uVar19 = 10;
        }
        else {
          uVar19 = this->RootWindowForTitleBarHighlight ==
                   (*(ImGuiWindow **)((long)IVar20 + 0x1ca0))->RootWindowForTitleBarHighlight | 10;
        }
        pIVar4 = local_48->DrawList;
        local_c8.x = (GImGui->Style).Colors[2].x;
        local_c8.y = (GImGui->Style).Colors[2].y;
        uVar8 = (GImGui->Style).Colors[2].z;
        uVar9 = (GImGui->Style).Colors[2].w;
        local_c8.w = (GImGui->Style).Alpha * (float)uVar9;
        local_c8.z = (float)uVar8;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRectFilled(pIVar4,(ImVec2 *)local_b0,(ImVec2 *)(local_b0 + 8),IVar17,0.0,0xf)
        ;
        pIVar4 = pIVar16->DrawList;
        puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar19 << 4));
        local_c8._0_8_ = *puVar1;
        uVar3 = puVar1[1];
        local_c8.w = (float)((ulong)uVar3 >> 0x20);
        local_c8.z = (float)uVar3;
        local_c8.w = (GImGui->Style).Alpha * local_c8.w;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRectFilled(pIVar4,(ImVec2 *)local_40,(ImVec2 *)(local_40 + 8),IVar17,0.0,0xf)
        ;
        pIVar4 = pIVar16->DrawList;
        local_c8.x = (GImGui->Style).Colors[5].x;
        local_c8.y = (GImGui->Style).Colors[5].y;
        uVar10 = (GImGui->Style).Colors[5].z;
        uVar11 = (GImGui->Style).Colors[5].w;
        local_c8.w = (GImGui->Style).Alpha * (float)uVar11;
        local_c8.z = (float)uVar10;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRect(pIVar4,(ImVec2 *)local_b0,(ImVec2 *)(local_b0 + 8),IVar17,0.0,0xf,1.0);
        IVar20 = local_78;
        pIVar4 = pIVar16->DrawList;
        font = *(ImFont **)((long)local_78 + 0x1978);
        local_68 = *(float *)((long)local_78 + 0x1980);
        local_c8.x = (GImGui->Style).Colors[0].x;
        local_c8.y = (GImGui->Style).Colors[0].y;
        uVar12 = (GImGui->Style).Colors[0].z;
        uVar13 = (GImGui->Style).Colors[0].w;
        local_c8.w = (GImGui->Style).Alpha * (float)uVar13;
        local_c8.z = (float)uVar12;
        IVar17 = ColorConvertFloat4ToU32(&local_c8);
        for (text_end = this->Name; text_end != (char *)0xffffffffffffffff; text_end = text_end + 1)
        {
          if (*text_end == '#') {
            if (text_end[1] == '#') goto LAB_00160dec;
          }
          else if (*text_end == '\0') goto LAB_00160dec;
        }
        text_end = (char *)0xffffffffffffffff;
LAB_00160dec:
        ImDrawList::AddText(pIVar4,font,local_68,(ImVec2 *)local_40,IVar17,this->Name,text_end,0.0,
                            (ImVec4 *)0x0);
        uVar19 = ((ImVector<ImGuiWindow_*> *)((long)IVar20 + 0x1a88))->Size;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar19);
  }
  local_c8.x = (GImGui->Style).Colors[5].x;
  local_c8.y = (GImGui->Style).Colors[5].y;
  uVar14 = (GImGui->Style).Colors[5].z;
  uVar15 = (GImGui->Style).Colors[5].w;
  local_c8.w = (GImGui->Style).Alpha * (float)uVar15;
  local_c8.z = (float)uVar14;
  IVar17 = ColorConvertFloat4ToU32(&local_c8);
  ImDrawList::AddRect(local_50,&local_a0->Min,local_58,IVar17,0.0,0xf,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}